

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

BlockInfo * kernel::MakeBlockInfo(BlockInfo *__return_storage_ptr__,CBlockIndex *index,CBlock *data)

{
  long lVar1;
  uint uVar2;
  uint256 *puVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (index == (CBlockIndex *)0x0) {
    __return_storage_ptr__->hash = &uint256::ZERO;
    __return_storage_ptr__->prev_hash = (uint256 *)0x0;
    __return_storage_ptr__->height = -1;
    __return_storage_ptr__->file_number = -1;
    __return_storage_ptr__->data_pos = 0;
    __return_storage_ptr__->undo_data = (CBlockUndo *)0x0;
    __return_storage_ptr__->chain_time_max = 0;
  }
  else {
    __return_storage_ptr__->hash = index->phashBlock;
    __return_storage_ptr__->undo_data = (CBlockUndo *)0x0;
    if (index->pprev == (CBlockIndex *)0x0) {
      puVar3 = (uint256 *)0x0;
    }
    else {
      puVar3 = index->pprev->phashBlock;
    }
    __return_storage_ptr__->prev_hash = puVar3;
    __return_storage_ptr__->height = index->nHeight;
    __return_storage_ptr__->chain_time_max = index->nTimeMax;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock1,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chain.cpp"
               ,0x15,false);
    uVar2 = index->nDataPos;
    __return_storage_ptr__->file_number = index->nFile;
    __return_storage_ptr__->data_pos = uVar2;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  }
  __return_storage_ptr__->data = data;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

interfaces::BlockInfo MakeBlockInfo(const CBlockIndex* index, const CBlock* data)
{
    interfaces::BlockInfo info{index ? *index->phashBlock : uint256::ZERO};
    if (index) {
        info.prev_hash = index->pprev ? index->pprev->phashBlock : nullptr;
        info.height = index->nHeight;
        info.chain_time_max = index->GetBlockTimeMax();
        LOCK(::cs_main);
        info.file_number = index->nFile;
        info.data_pos = index->nDataPos;
    }
    info.data = data;
    return info;
}